

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall
leveldb::CorruptionTest::Corrupt
          (CorruptionTest *this,FileType filetype,int offset,int bytes_to_corrupt)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  Env *pEVar5;
  size_type sVar6;
  reference filename;
  Tester *pTVar7;
  byte *pbVar8;
  Status local_988 [4];
  Tester local_968;
  Slice local_7c8;
  Status local_7b8;
  int local_7ac;
  int i_1;
  Tester local_788;
  Status local_5e8;
  Status s;
  string contents;
  Status local_5c0;
  Tester local_5b8;
  ulong local_418;
  uint64_t file_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  ulong local_230;
  size_t i;
  string local_220 [4];
  int picked_number;
  string fname;
  FileType local_1fc;
  uint64_t uStack_1f8;
  FileType type;
  uint64_t number;
  Tester local_1d8;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  int local_18;
  int bytes_to_corrupt_local;
  int offset_local;
  FileType filetype_local;
  CorruptionTest *this_local;
  
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = bytes_to_corrupt;
  bytes_to_corrupt_local = filetype;
  _offset_local = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  test::Tester::Tester
            (&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x73);
  pEVar5 = EnvWrapper::target((EnvWrapper *)this);
  (*pEVar5->_vptr_Env[7])(&number,pEVar5,&this->dbname_,local_38);
  test::Tester::IsOk(&local_1d8,(Status *)&number);
  Status::~Status((Status *)&number);
  test::Tester::~Tester(&local_1d8);
  std::__cxx11::string::string(local_220);
  i._4_4_ = -1;
  for (local_230 = 0; uVar2 = local_230,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38), uVar2 < sVar6; local_230 = local_230 + 1) {
    filename = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,local_230);
    bVar3 = ParseFileName(filename,&stack0xfffffffffffffe08,&local_1fc);
    if (((bVar3) && (local_1fc == bytes_to_corrupt_local)) && (i._4_4_ < (int)uStack_1f8)) {
      std::operator+(local_270,(char *)&this->dbname_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38,local_230);
      std::operator+(local_250,local_270);
      std::__cxx11::string::operator=(local_220,(string *)local_250);
      std::__cxx11::string::~string((string *)local_250);
      std::__cxx11::string::~string((string *)local_270);
      i._4_4_ = (int)uStack_1f8;
    }
  }
  test::Tester::Tester
            ((Tester *)&file_size,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x7f);
  bVar4 = std::__cxx11::string::empty();
  pTVar7 = test::Tester::Is((Tester *)&file_size,(bool)(bVar4 ^ 1),"!fname.empty()");
  test::Tester::operator<<(pTVar7,(FileType *)&bytes_to_corrupt_local);
  test::Tester::~Tester((Tester *)&file_size);
  test::Tester::Tester
            (&local_5b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x82);
  pEVar5 = EnvWrapper::target((EnvWrapper *)this);
  (*pEVar5->_vptr_Env[0xb])(&local_5c0,pEVar5,local_220,&local_418);
  test::Tester::IsOk(&local_5b8,&local_5c0);
  Status::~Status(&local_5c0);
  test::Tester::~Tester(&local_5b8);
  iVar1 = (int)local_418;
  local_18 = offset;
  if (offset < 0) {
    if (local_418 < (ulong)(long)-offset) {
      local_18 = 0;
    }
    else {
      local_18 = iVar1 + offset;
    }
  }
  if (local_418 < (ulong)(long)local_18) {
    local_18 = iVar1;
  }
  if (local_418 <
      (ulong)(long)(local_18 +
                   filenames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
    filenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar1 - local_18;
  }
  std::__cxx11::string::string((string *)&s);
  pEVar5 = EnvWrapper::target((EnvWrapper *)this);
  ReadFileToString((leveldb *)&local_5e8,pEVar5,(string *)local_220,(string *)&s);
  test::Tester::Tester
            (&local_788,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x96);
  bVar3 = Status::ok(&local_5e8);
  pTVar7 = test::Tester::Is(&local_788,bVar3,"s.ok()");
  Status::ToString_abi_cxx11_((Status *)&stack0xfffffffffffff858);
  test::Tester::operator<<
            (pTVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xfffffffffffff858);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff858);
  test::Tester::~Tester(&local_788);
  for (local_7ac = 0;
      local_7ac <
      filenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_7ac = local_7ac + 1) {
    pbVar8 = (byte *)std::__cxx11::string::operator[]((ulong)&s);
    *pbVar8 = *pbVar8 ^ 0x80;
  }
  pEVar5 = EnvWrapper::target((EnvWrapper *)this);
  Slice::Slice(&local_7c8,(string *)&s);
  WriteStringToFile((leveldb *)&local_7b8,pEVar5,&local_7c8,(string *)local_220);
  Status::operator=(&local_5e8,&local_7b8);
  Status::~Status(&local_7b8);
  test::Tester::Tester
            (&local_968,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x9b);
  bVar3 = Status::ok(&local_5e8);
  pTVar7 = test::Tester::Is(&local_968,bVar3,"s.ok()");
  Status::ToString_abi_cxx11_(local_988);
  test::Tester::operator<<
            (pTVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_988);
  std::__cxx11::string::~string((string *)local_988);
  test::Tester::~Tester(&local_968);
  Status::~Status(&local_5e8);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string(local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void Corrupt(FileType filetype, int offset, int bytes_to_corrupt) {
    // Pick file to corrupt
    std::vector<std::string> filenames;
    ASSERT_OK(env_.target()->GetChildren(dbname_, &filenames));
    uint64_t number;
    FileType type;
    std::string fname;
    int picked_number = -1;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) && type == filetype &&
          int(number) > picked_number) {  // Pick latest file
        fname = dbname_ + "/" + filenames[i];
        picked_number = number;
      }
    }
    ASSERT_TRUE(!fname.empty()) << filetype;

    uint64_t file_size;
    ASSERT_OK(env_.target()->GetFileSize(fname, &file_size));

    if (offset < 0) {
      // Relative to end of file; make it absolute
      if (-offset > file_size) {
        offset = 0;
      } else {
        offset = file_size + offset;
      }
    }
    if (offset > file_size) {
      offset = file_size;
    }
    if (offset + bytes_to_corrupt > file_size) {
      bytes_to_corrupt = file_size - offset;
    }

    // Do it
    std::string contents;
    Status s = ReadFileToString(env_.target(), fname, &contents);
    ASSERT_TRUE(s.ok()) << s.ToString();
    for (int i = 0; i < bytes_to_corrupt; i++) {
      contents[i + offset] ^= 0x80;
    }
    s = WriteStringToFile(env_.target(), contents, fname);
    ASSERT_TRUE(s.ok()) << s.ToString();
  }